

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureVectorizer_InputColumn>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *prototype)

{
  int iVar1;
  FeatureVectorizer_InputColumn *obj;
  Type *result;
  Type *prototype_local;
  RepeatedPtrFieldBase *this_local;
  
  if ((this->rep_ == (Rep *)0x0) || (this->rep_->allocated_size <= this->current_size_)) {
    obj = GenericTypeHandler<CoreML::Specification::FeatureVectorizer_InputColumn>::NewFromPrototype
                    (prototype,this->arena_);
    this_local = (RepeatedPtrFieldBase *)AddOutOfLineHelper(this,obj);
  }
  else {
    iVar1 = this->current_size_;
    this->current_size_ = iVar1 + 1;
    this_local = (RepeatedPtrFieldBase *)
                 cast<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureVectorizer_InputColumn>::TypeHandler>
                           (this->rep_->elements[iVar1]);
  }
  return (Type *)this_local;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::Add(
    typename TypeHandler::Type* prototype) {
  if (rep_ != nullptr && current_size_ < rep_->allocated_size) {
    return cast<TypeHandler>(rep_->elements[current_size_++]);
  }
  typename TypeHandler::Type* result =
      TypeHandler::NewFromPrototype(prototype, arena_);
  return reinterpret_cast<typename TypeHandler::Type*>(
      AddOutOfLineHelper(result));
}